

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int open_set_offered_capabilities(OPEN_HANDLE open,AMQP_VALUE offered_capabilities_value)

{
  int iVar1;
  AMQP_VALUE local_30;
  AMQP_VALUE offered_capabilities_amqp_value;
  OPEN_INSTANCE *open_instance;
  int result;
  AMQP_VALUE offered_capabilities_value_local;
  OPEN_HANDLE open_local;
  
  if (open == (OPEN_HANDLE)0x0) {
    open_instance._4_4_ = 0x78d;
  }
  else {
    if (offered_capabilities_value == (AMQP_VALUE)0x0) {
      local_30 = (AMQP_VALUE)0x0;
    }
    else {
      local_30 = amqpvalue_clone(offered_capabilities_value);
    }
    if (local_30 == (AMQP_VALUE)0x0) {
      open_instance._4_4_ = 0x79d;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(open->composite_value,7,local_30);
      if (iVar1 == 0) {
        open_instance._4_4_ = 0;
      }
      else {
        open_instance._4_4_ = 0x7a3;
      }
      amqpvalue_destroy(local_30);
    }
  }
  return open_instance._4_4_;
}

Assistant:

int open_set_offered_capabilities(OPEN_HANDLE open, AMQP_VALUE offered_capabilities_value)
{
    int result;

    if (open == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        OPEN_INSTANCE* open_instance = (OPEN_INSTANCE*)open;
        AMQP_VALUE offered_capabilities_amqp_value;
        if (offered_capabilities_value == NULL)
        {
            offered_capabilities_amqp_value = NULL;
        }
        else
        {
            offered_capabilities_amqp_value = amqpvalue_clone(offered_capabilities_value);
        }
        if (offered_capabilities_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(open_instance->composite_value, 7, offered_capabilities_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(offered_capabilities_amqp_value);
        }
    }

    return result;
}